

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

xmlChar * htmlParseHTMLName_nonInvasive(htmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  long lVar2;
  int len;
  byte bVar3;
  xmlChar loc [100];
  
  pxVar1 = ctxt->input->cur;
  bVar3 = pxVar1[1];
  if ((((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) || (bVar3 == 0x5f)) || (bVar3 == 0x3a)) {
    len = 100;
    for (lVar2 = 0; lVar2 != 100; lVar2 = lVar2 + 1) {
      bVar3 = pxVar1[lVar2 + 1];
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        bVar3 = bVar3 | 0x20;
      }
      else if ((9 < (byte)(bVar3 - 0x30) && 0x19 < (byte)(bVar3 + 0x9f)) &&
              ((0x32 < bVar3 - 0x2d ||
               ((0x4000000002001U >> ((ulong)(bVar3 - 0x2d) & 0x3f) & 1) == 0)))) {
        len = (int)lVar2;
        break;
      }
      loc[lVar2] = bVar3;
    }
    pxVar1 = xmlDictLookup(ctxt->dict,loc,len);
  }
  else {
    pxVar1 = (xmlChar *)0x0;
  }
  return pxVar1;
}

Assistant:

static const xmlChar *
htmlParseHTMLName_nonInvasive(htmlParserCtxtPtr ctxt) {
    int i = 0;
    xmlChar loc[HTML_PARSER_BUFFER_SIZE];

    if (!IS_ASCII_LETTER(NXT(1)) && (NXT(1) != '_') &&
        (NXT(1) != ':')) return(NULL);

    while ((i < HTML_PARSER_BUFFER_SIZE) &&
           ((IS_ASCII_LETTER(NXT(1+i))) || (IS_ASCII_DIGIT(NXT(1+i))) ||
	   (NXT(1+i) == ':') || (NXT(1+i) == '-') || (NXT(1+i) == '_'))) {
	if ((NXT(1+i) >= 'A') && (NXT(1+i) <= 'Z')) loc[i] = NXT(1+i) + 0x20;
        else loc[i] = NXT(1+i);
	i++;
    }

    return(xmlDictLookup(ctxt->dict, loc, i));
}